

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageImplementation::ImageImplementation
          (ImageImplementation *this,OperationContext *context,Resource *resource,
          VkShaderStageFlagBits stage,string *shaderPrefix,AccessMode mode,PipelineType pipelineType
          ,DispatchCall dispatchCall)

{
  VkImageSubresourceRange *pVVar1;
  VkShaderStageFlagBits VVar2;
  VkFormat VVar3;
  VkImageType VVar4;
  OperationContext *pOVar5;
  InstanceInterface *vki_00;
  DeviceInterface *vk;
  VkDevice device;
  VkPhysicalDevice physDevice_00;
  Allocator *allocator;
  size_t __n;
  Allocation *pAVar6;
  void *__s;
  Resource *pRVar7;
  VkImageView VVar8;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  DeviceInterface *pDVar9;
  GraphicsPipeline *pGVar10;
  Handle<(vk::HandleType)13> HVar11;
  VkDevice pVVar12;
  VkAllocationCallbacks *pVVar13;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar14;
  Handle<(vk::HandleType)19> HVar15;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar16;
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *this_00;
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *pMVar17;
  VkPipelineStageFlags VVar18;
  int iVar19;
  uint uVar20;
  TextureFormat format;
  Buffer *this_01;
  Image *pIVar21;
  DescriptorSetLayoutBuilder *pDVar22;
  DescriptorPoolBuilder *pDVar23;
  DescriptorSetUpdateBuilder *pDVar24;
  GraphicsPipeline *this_02;
  VkShaderStageFlagBits VVar25;
  Image *pIVar26;
  ulong uVar27;
  InstanceInterface *vki;
  VkImageType viewType;
  VkPhysicalDevice physDevice;
  VkDescriptorImageInfo srcImageInfo;
  VkDescriptorImageInfo dstImageInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_158;
  Move<vk::Handle<(vk::HandleType)19>_> *local_130;
  Move<vk::Handle<(vk::HandleType)19>_> local_128;
  Move<vk::Handle<(vk::HandleType)22>_> *local_108;
  Move<vk::Handle<(vk::HandleType)21>_> *local_100;
  Move<vk::Handle<(vk::HandleType)13>_> *local_f8;
  Move<vk::Handle<(vk::HandleType)13>_> *local_f0;
  undefined1 local_e8 [20];
  VkImageType VStack_d4;
  undefined8 uStack_d0;
  pointer local_c0;
  pointer local_b8;
  pointer local_a8;
  VkShaderStageFlagBits local_8c;
  OperationContext *local_88;
  string *local_80;
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_78
  ;
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  deUint32 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  deUint32 local_38;
  
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__ImageImplementation_00d37830;
  this->m_context = context;
  this->m_resource = resource;
  this->m_stage = stage;
  local_8c = stage;
  local_88 = context;
  local_80 = shaderPrefix;
  VVar18 = pipelineStageFlagsFromShaderStageFlagBits(stage);
  this->m_pipelineStage = VVar18;
  this->m_mode = mode;
  this->m_dispatchCall = dispatchCall;
  format = ::vk::mapVkFormat((resource->m_imageData).format);
  iVar19 = tcu::getPixelSize(format);
  this->m_hostBufferSizeBytes =
       (ulong)(iVar19 * (resource->m_imageData).extent.width * (resource->m_imageData).extent.height
              * (resource->m_imageData).extent.depth);
  local_78 = &this->m_hostBuffer;
  (this->m_hostBuffer).
  super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>.
  m_data.ptr = (Buffer *)0x0;
  local_70 = &this->m_image;
  (this->m_image).
  super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>.
  m_data.ptr = (Image *)0x0;
  local_f0 = &this->m_srcImageView;
  local_f8 = &this->m_dstImageView;
  local_100 = &this->m_descriptorPool;
  local_130 = &this->m_descriptorSetLayout;
  local_108 = &this->m_descriptorSet;
  memset(local_f0,0,0xa8);
  pOVar5 = this->m_context;
  vki_00 = pOVar5->m_vki;
  vk = pOVar5->m_vk;
  device = pOVar5->m_device;
  physDevice_00 = pOVar5->m_physicalDevice;
  allocator = pOVar5->m_allocator;
  VVar2 = this->m_stage;
  VVar25 = (VVar2 & VK_SHADER_STAGE_FRAGMENT_BIT) + VK_SHADER_STAGE_GEOMETRY_BIT;
  if ((VVar2 & (VK_SHADER_STAGE_GEOMETRY_BIT|VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|
                VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT)) == 0) {
    VVar25 = VVar2 & VK_SHADER_STAGE_FRAGMENT_BIT;
  }
  requireFeatures(vki_00,physDevice_00,
                  (uint)((VVar2 & (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|
                                  VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)) != 0) |
                  VVar2 >> 2 & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VVar25);
  VVar3 = (this->m_resource->m_imageData).format;
  uVar20 = VVar3 - VK_FORMAT_R16_UINT;
  if (((uVar20 < 0x1e) && ((0x3806039fU >> (uVar20 & 0x1f) & 1) != 0)) ||
     ((uVar20 = VVar3 - VK_FORMAT_R8_UNORM, uVar20 < 0x3f &&
      ((0x60000000000019b3U >> ((ulong)uVar20 & 0x3f) & 1) != 0)))) {
    requireFeatures(vki_00,physDevice_00,0x40);
  }
  this_01 = (Buffer *)operator_new(0x30);
  this_00 = local_78;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_e8,this->m_hostBufferSizeBytes,3);
  synchronization::Buffer::Buffer
            (this_01,vk,device,allocator,(VkBufferCreateInfo *)local_e8,(MemoryRequirement)0x1);
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  if ((this_00->
      super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
      ).m_data.ptr != this_01) {
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(&this_00->
           super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
         );
    (this_00->
    super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
    ).m_data.ptr = this_01;
  }
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            ((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_158);
  __n = this->m_hostBufferSizeBytes;
  pAVar6 = (((this->m_hostBuffer).
             super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             .m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  __s = pAVar6->m_hostPtr;
  if (this->m_mode == ACCESS_MODE_READ) {
    memset(__s,0,__n);
  }
  else if (__n != 0) {
    uVar27 = 0;
    do {
      *(undefined1 *)((long)__s + uVar27) =
           (&synchronization::(anonymous_namespace)::fillPattern(void*,unsigned_long)::pattern)
           [uVar27 % 0xb];
      uVar27 = uVar27 + 1;
    } while ((uVar27 & 0xffffffff) < __n);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,
             this->m_hostBufferSizeBytes);
  pIVar21 = (Image *)operator_new(0x30);
  pRVar7 = this->m_resource;
  makeImageCreateInfo((VkImageCreateInfo *)local_e8,(pRVar7->m_imageData).imageType,
                      &(pRVar7->m_imageData).extent,(pRVar7->m_imageData).format,0xb);
  synchronization::Image::Image
            (pIVar21,vk,device,allocator,(VkImageCreateInfo *)local_e8,(MemoryRequirement)0x0);
  pMVar17 = local_70;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  if ((local_70->
      super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
      ).m_data.ptr != pIVar21) {
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
              (&local_70->
                super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              );
    (pMVar17->
    super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>)
    .m_data.ptr = pIVar21;
  }
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
            ((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_158);
  pRVar7 = this->m_resource;
  pIVar21 = (this->m_image).
            super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            .m_data.ptr;
  pIVar26 = (Image *)&pRVar7->m_imageData;
  if (this->m_mode == ACCESS_MODE_READ) {
    pIVar26 = pIVar21;
    pIVar21 = (Image *)&pRVar7->m_imageData;
  }
  this->m_srcImage = (VkImage *)pIVar21;
  this->m_dstImage = (VkImage *)pIVar26;
  VVar4 = (pRVar7->m_imageData).imageType;
  viewType = 7;
  if (VVar4 < VK_IMAGE_TYPE_LAST) {
    viewType = VVar4;
  }
  local_38 = (pRVar7->m_imageData).subresourceRange.layerCount;
  pVVar1 = &(pRVar7->m_imageData).subresourceRange;
  local_48._0_4_ = pVVar1->aspectMask;
  local_48._4_4_ = pVVar1->baseMipLevel;
  uStack_40._0_4_ = (pRVar7->m_imageData).subresourceRange.levelCount;
  uStack_40._4_4_ = (pRVar7->m_imageData).subresourceRange.baseArrayLayer;
  makeImageView(&local_158,vk,device,
                (VkImage)(pIVar21->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,viewType,(pRVar7->m_imageData).format,*pVVar1);
  pVVar13 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar12 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar9 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  stack0xffffffffffffff28 =
       (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  uStack_d0 = (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar8.m_internal =
       (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar8.m_internal == 0) {
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = pVVar12;
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVVar13;
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         HVar11.m_internal;
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface = pDVar9
    ;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_srcImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
               ,VVar8);
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         (VkDevice)stack0xffffffffffffff28;
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)uStack_d0;
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         local_e8._0_8_;
    (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_e8._8_8_;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  pRVar7 = this->m_resource;
  local_58 = (pRVar7->m_imageData).subresourceRange.layerCount;
  pVVar1 = &(pRVar7->m_imageData).subresourceRange;
  local_68._0_4_ = pVVar1->aspectMask;
  local_68._4_4_ = pVVar1->baseMipLevel;
  uStack_60._0_4_ = (pRVar7->m_imageData).subresourceRange.levelCount;
  uStack_60._4_4_ = (pRVar7->m_imageData).subresourceRange.baseArrayLayer;
  makeImageView(&local_158,vk,device,(VkImage)this->m_dstImage->m_internal,viewType,
                (pRVar7->m_imageData).format,*pVVar1);
  pVVar13 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar12 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar9 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  stack0xffffffffffffff28 =
       (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  uStack_d0 = (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar8.m_internal =
       (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar8.m_internal == 0) {
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = pVVar12;
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVVar13;
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         HVar11.m_internal;
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface = pDVar9
    ;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_dstImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
               ,VVar8);
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         (VkDevice)stack0xffffffffffffff28;
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)uStack_d0;
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         local_e8._0_8_;
    (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_e8._8_8_;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_e8);
  pDVar22 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)local_e8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,
                       this->m_stage,(VkSampler *)0x0);
  pDVar22 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar22,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,this->m_stage,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_128,pDVar22,vk,device,0);
  pVVar13 = local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  pVVar12 = local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  pDVar9 = local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  HVar15.m_internal =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_device = pVVar12;
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_allocator = pVVar13
    ;
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         HVar15.m_internal;
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_deviceIface =
         pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_device =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_allocator =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_deviceIface =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    if (local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
                 (VkDescriptorSetLayout)
                 local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
  }
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (uStack_d0 != (pointer)0x0) {
    operator_delete(uStack_d0,(long)local_c0 - (long)uStack_d0);
  }
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,(long)stack0xffffffffffffff28 - local_e8._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_128);
  pDVar23 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_128,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  pDVar23 = ::vk::DescriptorPoolBuilder::addType(pDVar23,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_158,pDVar23,vk,device,1,1);
  pVVar13 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar12 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar9 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  stack0xffffffffffffff28 =
       (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  uStack_d0 = (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_device = pVVar12;
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_allocator = pVVar13
    ;
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
         HVar11.m_internal;
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_deviceIface =
         pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_device =
         (VkDevice)stack0xffffffffffffff28;
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)uStack_d0;
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
         local_e8._0_8_;
    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_e8._8_8_;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)
                 &local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((void *)local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                    m_internal);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_158,vk,device,
                    (VkDescriptorPool)
                    (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                    m_internal,
                    (VkDescriptorSetLayout)
                    (local_130->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                    m_internal);
  pVVar13 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar12 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar9 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  unique0x100012dd =
       (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  uStack_d0 = (pointer)local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
       (local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
  if (local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal == 0) {
    (local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device = pVVar12;
    (local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         (deUint64)pVVar13;
    (local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         HVar11.m_internal;
    (local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         pDVar9;
  }
  else {
    pDVar9 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    (*pDVar9->_vptr_DeviceInterface[0x3d])
              (pDVar9,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
    *(undefined4 *)
     &(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
         local_e8._16_4_;
    *(VkImageType *)
     ((long)&(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device + 4
     ) = VStack_d4;
    *(VkFormat *)
     &(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         (VkFormat)uStack_d0;
    *(deUint32 *)
     ((long)&(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.
             m_internal + 4) = uStack_d0._4_4_;
    *(undefined4 *)
     &(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         local_e8._0_4_;
    *(undefined4 *)
     ((long)&(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal +
     4) = local_e8._4_4_;
    *(undefined4 *)
     &(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         local_e8._8_4_;
    *(undefined4 *)
     ((long)&(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.
             m_deviceIface + 4) = local_e8._12_4_;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      local_e8._0_8_ =
           local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
      (*(local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                 m_deviceIface,
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device,
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
                );
    }
  }
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_f0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device.
                _4_4_,1);
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(local_128.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device.
                _4_4_,1);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_e8);
  pMVar16 = local_108;
  pDVar24 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)local_e8,
                       (int)(local_108->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.
                            object.m_internal,(void *)0x0,0);
  pDVar24 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (pDVar24,(int)(pMVar16->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data
                                    .object.m_internal,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar24,vk,device);
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (uStack_d0 != (pointer)0x0) {
    operator_delete(uStack_d0,(long)local_c0 - (long)uStack_d0);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)local_e8);
  pMVar14 = local_130;
  if (pipelineType == PIPELINE_TYPE_GRAPHICS) {
    this_02 = (GraphicsPipeline *)operator_new(0x120);
    GraphicsPipeline::GraphicsPipeline
              (this_02,local_88,local_8c,local_80,
               (VkDescriptorSetLayout)
               (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal);
  }
  else {
    this_02 = (GraphicsPipeline *)operator_new(0x60);
    ComputePipeline::ComputePipeline
              ((ComputePipeline *)this_02,local_88,this->m_dispatchCall,local_80,
               (VkDescriptorSetLayout)
               (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
               object.m_internal);
  }
  pGVar10 = (GraphicsPipeline *)
            (this->m_pipeline).
            super_UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
            .m_data.ptr;
  if (pGVar10 != this_02) {
    if (pGVar10 != (GraphicsPipeline *)0x0) {
      (*(pGVar10->super_Pipeline)._vptr_Pipeline[1])();
    }
    (this->m_pipeline).
    super_UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
    .m_data.ptr = &this_02->super_Pipeline;
  }
  return;
}

Assistant:

ImageImplementation (OperationContext&				context,
						 Resource&						resource,
						 const VkShaderStageFlagBits	stage,
						 const std::string&				shaderPrefix,
						 const AccessMode				mode,
						 const PipelineType				pipelineType,
						 const DispatchCall				dispatchCall)
		: m_context				(context)
		, m_resource			(resource)
		, m_stage				(stage)
		, m_pipelineStage		(pipelineStageFlagsFromShaderStageFlagBits(m_stage))
		, m_mode				(mode)
		, m_dispatchCall		(dispatchCall)
		, m_hostBufferSizeBytes	(getPixelBufferSize(m_resource.getImage().format, m_resource.getImage().extent))
	{
		const DeviceInterface&		vk			= m_context.getDeviceInterface();
		const InstanceInterface&	vki			= m_context.getInstanceInterface();
		const VkDevice				device		= m_context.getDevice();
		const VkPhysicalDevice		physDevice	= m_context.getPhysicalDevice();
		Allocator&					allocator	= m_context.getAllocator();

		// Image stores are always required, in either access mode.
		requireFeaturesForSSBOAccess(m_context, m_stage);

		// Some storage image formats require additional capability.
		if (isStorageImageExtendedFormat(m_resource.getImage().format))
			requireFeatures(vki, physDevice, FEATURE_SHADER_STORAGE_IMAGE_EXTENDED_FORMATS);

		m_hostBuffer = de::MovePtr<Buffer>(new Buffer(
			vk, device, allocator, makeBufferCreateInfo(m_hostBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT),
			MemoryRequirement::HostVisible));

		// Init host buffer data
		{
			const Allocation& alloc = m_hostBuffer->getAllocation();
			if (m_mode == ACCESS_MODE_READ)
				deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(m_hostBufferSizeBytes));
			else
				fillPattern(alloc.getHostPtr(), m_hostBufferSizeBytes);
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_hostBufferSizeBytes);
		}

		// Image resources
		{
			m_image = de::MovePtr<Image>(new Image(vk, device, allocator,
				makeImageCreateInfo(m_resource.getImage().imageType, m_resource.getImage().extent, m_resource.getImage().format,
									VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_STORAGE_BIT),
				MemoryRequirement::Any));

			if (m_mode == ACCESS_MODE_READ)
			{
				m_srcImage = &m_resource.getImage().handle;
				m_dstImage = &(**m_image);
			}
			else
			{
				m_srcImage = &(**m_image);
				m_dstImage = &m_resource.getImage().handle;
			}

			const VkImageViewType viewType = getImageViewType(m_resource.getImage().imageType);

			m_srcImageView	= makeImageView(vk, device, *m_srcImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
			m_dstImageView	= makeImageView(vk, device, *m_dstImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
		}

		// Prepare descriptors
		{
			m_descriptorSetLayout = DescriptorSetLayoutBuilder()
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.build(vk, device);

			m_descriptorPool = DescriptorPoolBuilder()
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

			m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

			const VkDescriptorImageInfo srcImageInfo = makeDescriptorImageInfo(DE_NULL, *m_srcImageView, VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo dstImageInfo = makeDescriptorImageInfo(DE_NULL, *m_dstImageView, VK_IMAGE_LAYOUT_GENERAL);

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &srcImageInfo)
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &dstImageInfo)
				.update(vk, device);
		}

		// Create pipeline
		m_pipeline = (pipelineType == PIPELINE_TYPE_GRAPHICS ? de::MovePtr<Pipeline>(new GraphicsPipeline(context, stage, shaderPrefix, *m_descriptorSetLayout))
															 : de::MovePtr<Pipeline>(new ComputePipeline(context, m_dispatchCall, shaderPrefix, *m_descriptorSetLayout)));
	}